

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O3

int __thiscall
bdConnectManager::requestConnection_direct
          (bdConnectManager *this,sockaddr_in *laddr,bdNodeId *target)

{
  list<bdProxyId,_std::allocator<bdProxyId>_> *plVar1;
  undefined4 uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  int iVar7;
  iterator iVar8;
  _List_node_base *p_Var9;
  mapped_type *pmVar10;
  long lVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  _Node_conflict *__tmp_1;
  _Self __tmp;
  _List_node_base *p_Var14;
  byte bVar15;
  list<bdId,_std::allocator<bdId>_> matchIds;
  list<bdId,_std::allocator<bdId>_> goodProxies;
  bdConnectionRequest connreq;
  _List_node_base local_128;
  undefined8 local_118;
  _List_node_base _Stack_110;
  undefined8 uStack_100;
  bdConnectionRequest local_f8;
  
  bVar15 = 0;
  bdConnectionRequest::bdConnectionRequest(&local_f8);
  iVar8 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdConnectionRequest>,_std::_Select1st<std::pair<const_bdNodeId,_bdConnectionRequest>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdConnectionRequest>_>_>
          ::find(&(this->mConnectionRequests)._M_t,target);
  iVar7 = 0;
  if ((_Rb_tree_header *)iVar8._M_node ==
      &(this->mConnectionRequests)._M_t._M_impl.super__Rb_tree_header) {
    local_f8.mState = 1;
    local_f8.mStateTS = time((time_t *)0x0);
    local_f8.mPauseTS = 0;
    local_f8.mTarget.data._0_8_ = *(undefined8 *)target->data;
    local_f8.mTarget.data._8_8_ = *(undefined8 *)(target->data + 8);
    local_f8.mTarget.data._16_4_ = *(undefined4 *)(target->data + 0x10);
    local_f8.mLocalAddr.sin_family = laddr->sin_family;
    local_f8.mLocalAddr.sin_port = laddr->sin_port;
    local_f8.mLocalAddr.sin_addr.s_addr = (laddr->sin_addr).s_addr;
    local_f8.mLocalAddr.sin_zero = *&laddr->sin_zero;
    local_f8.mMode = 1;
    local_f8.mRecycled = 0;
    local_f8.mErrCode = 0;
    local_f8.mDelay = 0;
    local_f8.mRequestTS = time((time_t *)0x0);
    uStack_100 = 0;
    _Stack_110._M_next = &_Stack_110;
    _Stack_110._M_prev = &_Stack_110;
    bdQueryManager::result(this->mQueryMgr,target,(list<bdId,_std::allocator<bdId>_> *)&_Stack_110);
    for (p_Var14 = _Stack_110._M_next; p_Var14 != &_Stack_110;
        p_Var14 = (((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var14->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next) {
      uVar2 = *(undefined4 *)
               &(((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var14[3]._M_next)->_M_impl)._M_node.
                super__List_node_base._M_next;
      p_Var3 = p_Var14[1]._M_next;
      p_Var4 = p_Var14[1]._M_prev;
      p_Var5 = p_Var14[2]._M_next;
      p_Var6 = p_Var14[2]._M_prev;
      p_Var9 = (_List_node_base *)operator_new(0x40);
      *(undefined4 *)&p_Var9[3]._M_next = uVar2;
      p_Var9[2]._M_next = p_Var5;
      p_Var9[2]._M_prev = p_Var6;
      p_Var9[1]._M_next = p_Var3;
      p_Var9[1]._M_prev = p_Var4;
      *(undefined8 *)((long)&p_Var9[3]._M_next + 4) = 1;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl._M_node.
      _M_size = local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                _M_impl._M_node._M_size + 1;
    }
    plVar1 = &local_f8.mGoodProxies;
    if (local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
        _M_node._M_size == 0) {
      local_118 = 0;
      local_128._M_next = &local_128;
      local_128._M_prev = &local_128;
      bdSpace::find_node(this->mNodeSpace,target,10,(list<bdId,_std::allocator<bdId>_> *)&local_128,
                         0x200);
      p_Var14 = local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      for (p_Var3 = local_128._M_next; p_Var4 = local_128._M_next,
          local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
          _M_node.super__List_node_base._M_next = p_Var14, p_Var3 != &local_128;
          p_Var3 = (((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
                   super__List_node_base._M_next) {
        if (p_Var14 != (_List_node_base *)plVar1) {
          do {
            iVar7 = operator==((bdId *)(p_Var14 + 1),(bdId *)(p_Var3 + 1));
            if (iVar7 != 0) {
              if (p_Var14 != (_List_node_base *)plVar1) goto LAB_0011e10e;
              break;
            }
            p_Var14 = p_Var14->_M_next;
          } while (p_Var14 != (_List_node_base *)plVar1);
        }
        uVar2 = *(undefined4 *)
                 &(((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var3[3]._M_next)->_M_impl)._M_node
                  .super__List_node_base._M_next;
        p_Var14 = p_Var3[1]._M_next;
        p_Var4 = p_Var3[1]._M_prev;
        p_Var5 = p_Var3[2]._M_next;
        p_Var6 = p_Var3[2]._M_prev;
        p_Var9 = (_List_node_base *)operator_new(0x40);
        *(undefined4 *)&p_Var9[3]._M_next = uVar2;
        p_Var9[2]._M_next = p_Var5;
        p_Var9[2]._M_prev = p_Var6;
        p_Var9[1]._M_next = p_Var14;
        p_Var9[1]._M_prev = p_Var4;
        *(undefined8 *)((long)&p_Var9[3]._M_next + 4) = 5;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
        _M_node._M_size =
             local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
             _M_node._M_size + 1;
LAB_0011e10e:
        p_Var14 = local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
      }
      while (p_Var4 != &local_128) {
        p_Var14 = p_Var4->_M_next;
        operator_delete(p_Var4,0x38);
        p_Var4 = p_Var14;
      }
    }
    if (1 < local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
            _M_node._M_size) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bdConnectManager::requestConnection_direct() ERROR Multiple Peers for DIRECT connection"
                 ,0x57);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
    }
    pmVar10 = std::
              map<bdNodeId,_bdConnectionRequest,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdConnectionRequest>_>_>
              ::operator[](&this->mConnectionRequests,target);
    pmVar12 = &local_f8;
    pmVar13 = pmVar10;
    for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(undefined8 *)(pmVar13->mTarget).data = *(undefined8 *)(pmVar12->mTarget).data;
      pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar15 * -0x10 + 8);
      pmVar13 = (mapped_type *)((long)pmVar13 + (ulong)bVar15 * -0x10 + 8);
    }
    if (pmVar10 == &local_f8) {
      *(ulong *)((pmVar10->mCurrentAttempt).id.data + 8) =
           CONCAT44(local_f8.mCurrentAttempt.id.data._12_4_,local_f8.mCurrentAttempt.id.data._8_4_);
      *(ulong *)((pmVar10->mCurrentAttempt).id.data + 0x10) =
           CONCAT44(local_f8.mCurrentSrcType,local_f8.mCurrentAttempt.id.data._16_4_);
      *(ulong *)((pmVar10->mCurrentAttempt).addr.sin_zero + 4) =
           CONCAT44(local_f8.mCurrentAttempt.id.data._0_4_,
                    local_f8.mCurrentAttempt.addr.sin_zero._4_4_);
      *(ulong *)((pmVar10->mCurrentAttempt).id.data + 4) =
           CONCAT44(local_f8.mCurrentAttempt.id.data._8_4_,local_f8.mCurrentAttempt.id.data._4_4_);
      pmVar10->mRecycled = local_f8.mRecycled;
      (pmVar10->mCurrentAttempt).addr.sin_family = local_f8.mCurrentAttempt.addr.sin_family;
      (pmVar10->mCurrentAttempt).addr.sin_port = local_f8.mCurrentAttempt.addr.sin_port;
      (pmVar10->mCurrentAttempt).addr.sin_addr =
           (in_addr)local_f8.mCurrentAttempt.addr.sin_addr.s_addr;
      (pmVar10->mCurrentAttempt).addr.sin_zero[0] = local_f8.mCurrentAttempt.addr.sin_zero[0];
      (pmVar10->mCurrentAttempt).addr.sin_zero[1] = local_f8.mCurrentAttempt.addr.sin_zero[1];
      (pmVar10->mCurrentAttempt).addr.sin_zero[2] = local_f8.mCurrentAttempt.addr.sin_zero[2];
      (pmVar10->mCurrentAttempt).addr.sin_zero[3] = local_f8.mCurrentAttempt.addr.sin_zero[3];
      p_Var14 = _Stack_110._M_next;
    }
    else {
      std::__cxx11::list<bdProxyId,std::allocator<bdProxyId>>::
      _M_assign_dispatch<std::_List_const_iterator<bdProxyId>>
                ((list<bdProxyId,std::allocator<bdProxyId>> *)&pmVar10->mGoodProxies,
                 local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                 _M_impl._M_node.super__List_node_base._M_next,plVar1);
      std::__cxx11::list<bdId,std::allocator<bdId>>::
      _M_assign_dispatch<std::_List_const_iterator<bdId>>
                ((list<bdId,std::allocator<bdId>> *)&pmVar10->mPotentialProxies,
                 local_f8.mPotentialProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl.
                 _M_node.super__List_node_base._M_next);
      *(undefined4 *)((pmVar10->mCurrentAttempt).id.data + 8) =
           local_f8.mCurrentAttempt.id.data._8_4_;
      *(undefined4 *)((pmVar10->mCurrentAttempt).id.data + 0xc) =
           local_f8.mCurrentAttempt.id.data._12_4_;
      *(undefined4 *)((pmVar10->mCurrentAttempt).id.data + 0x10) =
           local_f8.mCurrentAttempt.id.data._16_4_;
      pmVar10->mCurrentSrcType = local_f8.mCurrentSrcType;
      *(undefined4 *)((pmVar10->mCurrentAttempt).addr.sin_zero + 4) =
           local_f8.mCurrentAttempt.addr.sin_zero._4_4_;
      *(undefined4 *)(pmVar10->mCurrentAttempt).id.data = local_f8.mCurrentAttempt.id.data._0_4_;
      *(undefined4 *)((pmVar10->mCurrentAttempt).id.data + 4) =
           local_f8.mCurrentAttempt.id.data._4_4_;
      *(undefined4 *)((pmVar10->mCurrentAttempt).id.data + 8) =
           local_f8.mCurrentAttempt.id.data._8_4_;
      pmVar10->mRecycled = local_f8.mRecycled;
      (pmVar10->mCurrentAttempt).addr.sin_family = local_f8.mCurrentAttempt.addr.sin_family;
      (pmVar10->mCurrentAttempt).addr.sin_port = local_f8.mCurrentAttempt.addr.sin_port;
      (pmVar10->mCurrentAttempt).addr.sin_addr.s_addr =
           local_f8.mCurrentAttempt.addr.sin_addr.s_addr;
      *(undefined4 *)(pmVar10->mCurrentAttempt).addr.sin_zero =
           local_f8.mCurrentAttempt.addr.sin_zero._0_4_;
      std::__cxx11::list<bdProxyId,std::allocator<bdProxyId>>::
      _M_assign_dispatch<std::_List_const_iterator<bdProxyId>>
                ((list<bdProxyId,std::allocator<bdProxyId>> *)&pmVar10->mPeersTried,
                 local_f8.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                 _M_impl._M_node.super__List_node_base._M_next,&local_f8.mPeersTried);
      p_Var14 = _Stack_110._M_next;
    }
    while (p_Var14 != &_Stack_110) {
      p_Var3 = p_Var14->_M_next;
      operator_delete(p_Var14,0x38);
      p_Var14 = p_Var3;
    }
    iVar7 = 1;
  }
  while (local_f8.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.mPeersTried) {
    p_Var14 = (local_f8.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
               _M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_f8.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                    _M_impl._M_node.super__List_node_base._M_next,0x40);
    local_f8.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var14;
  }
  while (local_f8.mPotentialProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_f8.mPotentialProxies) {
    p_Var14 = (local_f8.mPotentialProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl.
               _M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_f8.mPotentialProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl
                    ._M_node.super__List_node_base._M_next,0x38);
    local_f8.mPotentialProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var14;
  }
  while (local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.mGoodProxies) {
    p_Var14 = (local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl
               ._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                    _M_impl._M_node.super__List_node_base._M_next,0x40);
    local_f8.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var14;
  }
  return iVar7;
}

Assistant:

int bdConnectManager::requestConnection_direct(struct sockaddr_in *laddr, bdNodeId *target) {

#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::requestConnection_direct()";
	std::cerr << std::endl;
#endif
	/* create a bdConnect, and put into the queue */
	bdConnectionRequest connreq;
	
	if (checkExistingConnectionAttempt(target)) {
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::requestConnection_direct() Existing ConnectionRequest... NOOP";
		std::cerr << std::endl;
#endif
		return 0;
	}

	connreq.setupDirectConnection(laddr, target);

	std::list<bdId> goodProxies;
	std::list<bdId>::iterator pit;
	mQueryMgr->result(target, goodProxies);
	for (pit = goodProxies.begin(); pit != goodProxies.end(); pit++)
		connreq.mGoodProxies.push_back(bdProxyId(*pit, BD_PI_SRC_QUERYRESULT, 0));

	/* now look in the bdSpace as well */
	if (connreq.mGoodProxies.size() < MIN_START_DIRECT_COUNT) {
		int number = CONNECT_NUM_PROXY_ATTEMPTS;
		int with_flag = BITDHT_PEER_STATUS_DHT_ENGINE_VERSION;
		std::list<bdId> matchIds;
		std::list<bdId>::iterator it;
		std::list<bdProxyId>::iterator git;
		
		mNodeSpace->find_node(target, number, matchIds, with_flag);

		/* merge lists (costly should use sets or something) */
		for (it = matchIds.begin(); it != matchIds.end(); it++) {
			for (git = connreq.mGoodProxies.begin(); git != connreq.mGoodProxies.end(); git++)
				if (git->id == *it)
					break;
			if (git == connreq.mGoodProxies.end())
				connreq.mGoodProxies.push_back(bdProxyId(*it, BD_PI_SRC_NODESPACE_ENGINEVERSION, 0));
		}
	}

	/* Actually if we lots of ids at this point... its likely that something is wrong 
	 */

	if (connreq.mGoodProxies.size() > 1) {
		std::cerr << "bdConnectManager::requestConnection_direct() ERROR Multiple Peers for DIRECT connection";
		std::cerr << std::endl;
	}

#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::requestConnection_direct() CRINITSTATE Init Connection State";
	std::cerr << std::endl;
	std::cerr << connreq;
	std::cerr << std::endl;
#endif

	/* push connect onto queue, for later completion */

	mConnectionRequests[*target] = connreq;

	/* connection continued via iterator */
	return 1;
}